

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_int_pro_row_c(int16_t *hbuf,uint8_t *ref,int ref_stride,int width,int height,
                      int norm_factor)

{
  int i;
  int idx;
  int norm_factor_local;
  int height_local;
  int width_local;
  int ref_stride_local;
  uint8_t *ref_local;
  int16_t *hbuf_local;
  
  ref_local = ref;
  for (idx = 0; idx < width; idx = idx + 1) {
    hbuf[idx] = 0;
    for (i = 0; i < height; i = i + 1) {
      hbuf[idx] = hbuf[idx] + (ushort)ref_local[i * ref_stride];
    }
    hbuf[idx] = (int16_t)((int)hbuf[idx] >> ((byte)norm_factor & 0x1f));
    ref_local = ref_local + 1;
  }
  return;
}

Assistant:

void aom_int_pro_row_c(int16_t *hbuf, const uint8_t *ref, const int ref_stride,
                       const int width, const int height, int norm_factor) {
  assert(height >= 2);
  for (int idx = 0; idx < width; ++idx) {
    hbuf[idx] = 0;
    // hbuf[idx]: 14 bit, dynamic range [0, 32640].
    for (int i = 0; i < height; ++i) hbuf[idx] += ref[i * ref_stride];
    // hbuf[idx]: 9 bit, dynamic range [0, 1020].
    hbuf[idx] >>= norm_factor;
    ++ref;
  }
}